

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O0

Node * __thiscall
mapbox::detail::Earcut<unsigned_int>::eliminateHole
          (Earcut<unsigned_int> *this,Node *hole,Node *outerNode)

{
  Node *a;
  Node *start;
  Node *bridgeReverse;
  Node *bridge;
  Node *outerNode_local;
  Node *hole_local;
  Earcut<unsigned_int> *this_local;
  
  a = findHoleBridge(this,hole,outerNode);
  this_local = (Earcut<unsigned_int> *)outerNode;
  if (a != (Node *)0x0) {
    start = splitPolygon(this,a,hole);
    filterPoints(this,start,start->next);
    this_local = (Earcut<unsigned_int> *)filterPoints(this,a,a->next);
  }
  return (Node *)this_local;
}

Assistant:

typename Earcut<N>::Node*
Earcut<N>::eliminateHole(Node* hole, Node* outerNode) {
    Node* bridge = findHoleBridge(hole, outerNode);
    if (!bridge) {
        return outerNode;
    }

    Node* bridgeReverse = splitPolygon(bridge, hole);

    // filter collinear points around the cuts
    filterPoints(bridgeReverse, bridgeReverse->next);

    // Check if input node was removed by the filtering
    return filterPoints(bridge, bridge->next);
}